

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

bool DerBase::DecodeSetOrSequenceOf<CertificateList>
               (DerType type,uchar *pIn,size_t cbIn,size_t *cbPrefix,size_t *cbSize,
               vector<CertificateList,_std::allocator<CertificateList>_> *out)

{
  bool bVar1;
  overflow_error *this;
  undefined1 local_290 [8];
  CertificateList t;
  size_t cbElement;
  size_t offset;
  vector<CertificateList,_std::allocator<CertificateList>_> *pvStack_38;
  bool isNull;
  vector<CertificateList,_std::allocator<CertificateList>_> *out_local;
  size_t *cbSize_local;
  size_t *cbPrefix_local;
  size_t cbIn_local;
  uchar *pIn_local;
  DerType type_local;
  
  offset._7_1_ = 0;
  pvStack_38 = out;
  out_local = (vector<CertificateList,_std::allocator<CertificateList>_> *)cbSize;
  cbSize_local = cbPrefix;
  cbPrefix_local = (size_t *)cbIn;
  cbIn_local = (size_t)pIn;
  pIn_local._0_4_ = type;
  std::vector<CertificateList,_std::allocator<CertificateList>_>::clear(out);
  bVar1 = DecodeSequenceOrSet((DerType)pIn_local,(uchar *)cbIn_local,(size_t)cbPrefix_local,
                              cbSize_local,(size_t *)out_local,(bool *)((long)&offset + 7));
  if (bVar1) {
    if ((offset._7_1_ & 1) == 0) {
      cbElement = *cbSize_local;
      cbPrefix_local = (size_t *)(*cbSize_local + *(long *)out_local);
      do {
        t.signatureValue.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        CertificateList::CertificateList((CertificateList *)local_290);
        if (cbPrefix_local < cbElement) {
          this = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error(this,"Integer overflow");
          __cxa_throw(this,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        bVar1 = CertificateList::Decode
                          ((CertificateList *)local_290,(uchar *)(cbIn_local + cbElement),
                           (long)cbPrefix_local - cbElement,
                           (size_t *)
                           &t.signatureValue.value.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar1) {
          cbElement = (size_t)(t.signatureValue.value.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + cbElement);
          std::vector<CertificateList,_std::allocator<CertificateList>_>::push_back
                    (pvStack_38,(value_type *)local_290);
          if ((pointer)cbElement == (pointer)(*(long *)out_local + *cbSize_local)) {
            pIn_local._7_1_ = 1;
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
        }
        else {
          if (t.signatureValue.value.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
            *cbSize_local = 0;
            *(undefined8 *)out_local = 0;
          }
          pIn_local._7_1_ = 0;
          bVar1 = true;
        }
        CertificateList::~CertificateList((CertificateList *)local_290);
      } while (!bVar1);
    }
    else {
      *cbSize_local = 2;
      *(undefined8 *)out_local = 0;
      pIn_local._7_1_ = 1;
    }
  }
  else {
    *cbSize_local = 0;
    *(undefined8 *)out_local = 0;
    pIn_local._7_1_ = 0;
  }
  return (bool)(pIn_local._7_1_ & 1);
}

Assistant:

static bool DecodeSetOrSequenceOf(DerType type, const unsigned char* pIn, size_t cbIn, size_t& cbPrefix, size_t& cbSize, std::vector<T>& out)
	{
		bool isNull = false;
		size_t offset = 0;

		out.clear();

		if (!DecodeSequenceOrSet(type, pIn, cbIn, cbPrefix, cbSize, isNull))
		{
			cbPrefix = 0;
			cbSize = 0;
			return false;
		}

		if (isNull)
		{
			cbPrefix = 2;
			cbSize = 0;
			return true;
		}

		offset = cbPrefix;
        cbIn = cbPrefix + cbSize;

		for (;;)
		{
			size_t cbElement = 0;
			T t;

			if (offset > cbIn)
				throw std::overflow_error("Integer overflow");

			if (!t.Decode(pIn + offset, cbIn - offset, cbElement))
			{
				// Accomodate the case where we have to decode into the 
				// sequence to see if the element is optional
				if( cbElement == 0 )
				{
					cbPrefix = 0;
					cbSize = 0;
				}
				return false;
			}

			offset += cbElement;
			out.push_back(t);

			// Exit conditions - should have used all of our
			// incoming data, as long as everything is polite
			if (offset == cbSize + cbPrefix)
			{
				return true;
			}
		}
	}